

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

void recharge_objects(void)

{
  byte bVar1;
  object *obj_00;
  _Bool _Var2;
  wchar_t wVar3;
  object *local_18;
  object *obj;
  _Bool discharged_stack;
  wchar_t i;
  
  local_18 = player->gear;
  while( true ) {
    if (local_18 == (object *)0x0) {
      for (obj._4_4_ = 1; obj._4_4_ < (int)(uint)cave->obj_max; obj._4_4_ = obj._4_4_ + 1) {
        obj_00 = cave->objects[obj._4_4_];
        if ((obj_00 != (object *)0x0) && (_Var2 = tval_can_have_timeout(obj_00), _Var2)) {
          recharge_timeout(obj_00);
        }
      }
      return;
    }
    if (local_18->kind == (object_kind *)0x0) break;
    _Var2 = object_is_equipped(player->body,local_18);
    if (_Var2) {
      _Var2 = recharge_timeout(local_18);
      if (_Var2) {
        recharged_notice(local_18,true);
        player->upkeep->redraw = player->upkeep->redraw | 0x40000;
      }
    }
    else {
      wVar3 = number_charging(local_18);
      bVar1 = local_18->number;
      _Var2 = tval_can_have_timeout(local_18);
      if ((_Var2) && (_Var2 = recharge_timeout(local_18), _Var2)) {
        if (local_18->timeout == 0) {
          recharged_notice(local_18,true);
        }
        else if (wVar3 == (uint)bVar1) {
          recharged_notice(local_18,false);
        }
        player->upkeep->notice = player->upkeep->notice | 1;
        player->upkeep->redraw = player->upkeep->redraw | 0x20000;
      }
    }
    local_18 = local_18->next;
  }
  __assert_fail("obj->kind",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/game-world.c"
                ,0xce,"void recharge_objects(void)");
}

Assistant:

static void recharge_objects(void)
{
	int i;
	bool discharged_stack;
	struct object *obj;

	/* Recharge carried gear */
	for (obj = player->gear; obj; obj = obj->next) {
		/* Skip non-objects */
		assert(obj->kind);

		/* Recharge equipment */
		if (object_is_equipped(player->body, obj)) {
			/* Recharge activatable objects */
			if (recharge_timeout(obj)) {
				/* Message if an item recharged */
				recharged_notice(obj, true);

				/* Window stuff */
				player->upkeep->redraw |= (PR_EQUIP);
			}
		} else {
			/* Recharge the inventory */
			discharged_stack =
				(number_charging(obj) == obj->number) ? true : false;

			/* Recharge rods, and update if any rods are recharged */
			if (tval_can_have_timeout(obj) && recharge_timeout(obj)) {
				/* Entire stack is recharged */
				if (obj->timeout == 0)
					recharged_notice(obj, true);

				/* Previously exhausted stack has acquired a charge */
				else if (discharged_stack)
					recharged_notice(obj, false);

				/* Combine pack */
				player->upkeep->notice |= (PN_COMBINE);

				/* Redraw stuff */
				player->upkeep->redraw |= (PR_INVEN);
			}
		}
	}

	/* Recharge other level objects */
	for (i = 1; i < cave->obj_max; i++) {
		obj = cave->objects[i];
		if (!obj) continue;

		/* Recharge rods */
		if (tval_can_have_timeout(obj))
			recharge_timeout(obj);
	}
}